

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::DefinePropertiesHelperForProxyObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  DescriptorMap *pDVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  JavascriptArray *pJVar8;
  Recycler *this;
  char *pcVar9;
  undefined4 extraout_var;
  Var pvVar10;
  PropertyRecord *pPVar11;
  ulong uVar12;
  PropertyId propertyId;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  undefined1 local_a8 [8];
  TrackAllocData data;
  char *local_40;
  DescriptorMap *descriptors;
  PropertyRecord *propertyRecord;
  
  bVar4 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(props);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x7b8,"(VarIs<JavascriptProxy>(props))",
                                "VarIs<JavascriptProxy>(props)");
    if (!bVar4) goto LAB_00ce4ff1;
    *puVar7 = 0;
  }
  pJVar8 = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(props,scriptContext);
  uVar1 = (pJVar8->super_ArrayObject).length;
  uVar12 = (ulong)uVar1;
  EnterPinnedScope(&local_40);
  local_a8 = (undefined1  [8])
             &DefinePropertiesHelperForProxyObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
              ::DescriptorMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_7b0957b;
  data.filename._0_4_ = 0x7cb;
  data.plusSize = uVar12;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_a8);
  if (uVar12 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
    local_40 = &DAT_00000008;
    descriptors = (DescriptorMap *)0x0;
  }
  else {
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00ce4ff1;
      *puVar7 = 0;
    }
    pcVar9 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (this,uVar12 * 0x38);
    if (pcVar9 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00ce4ff1:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pcVar13 = pcVar9;
    do {
      pcVar13[0] = '\0';
      pcVar13[1] = '\0';
      pcVar13[2] = '\0';
      pcVar13[3] = '\0';
      pcVar13[4] = '\0';
      pcVar13[5] = '\0';
      pcVar13[6] = '\0';
      pcVar13[7] = '\0';
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)(pcVar13 + 8));
      pcVar13 = pcVar13 + 0x38;
    } while (pcVar13 != pcVar9 + uVar12 * 0x38);
    descriptors = (DescriptorMap *)0x0;
    local_40 = pcVar9;
    if (uVar12 != 0) {
      uVar12 = 0;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar14 = 0;
      do {
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a8);
        iVar6 = (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(pJVar8,uVar12);
        pvVar10 = (Var)CONCAT44(extraout_var,iVar6);
        bVar4 = VarIs<Js::JavascriptSymbol>(pvVar10);
        if ((!bVar4) && (bVar4 = VarIs<Js::JavascriptString>(pvVar10), !bVar4)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x7df,
                                      "(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey))"
                                      ,
                                      "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                     );
          if (!bVar4) goto LAB_00ce4ff1;
          *puVar7 = 0;
        }
        JavascriptConversion::ToPropertyKey
                  (pvVar10,scriptContext,(PropertyRecord **)&descriptors,(PropertyString **)0x0);
        iVar6 = *(int *)&(descriptors->descriptor).Value.ptr;
        propertyId = iVar6;
        if (iVar6 == -1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x7e2,"(propertyId != Constants::NoProperty)",
                                      "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty."
                                     );
          if (!bVar4) goto LAB_00ce4ff1;
          *puVar7 = 0;
          propertyId = *(PropertyId *)&(descriptors->descriptor).Value.ptr;
        }
        BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                          (props,propertyId,scriptContext,(PropertyDescriptor *)local_a8);
        if ((BVar5 != 0) &&
           (bVar4 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_a8), bVar4)) {
          pvVar10 = JavascriptOperators::GetProperty
                              (props,iVar6,scriptContext,(PropertyValueInfo *)0x0);
          lVar16 = lVar14 * 0x38;
          BVar5 = JavascriptOperators::ToPropertyDescriptor
                            (pvVar10,(PropertyDescriptor *)(local_40 + lVar16 + 8),scriptContext);
          if (BVar5 == 0) {
            pPVar11 = ScriptContext::GetPropertyName(scriptContext,iVar6);
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2c,(PCWSTR)(pPVar11 + 1));
          }
          if (DAT_015bc46b == '\x01') {
            ModifyGetterSetterFuncName
                      ((PropertyRecord *)descriptors,(PropertyDescriptor *)(local_40 + lVar16 + 8),
                       scriptContext);
          }
          pDVar3 = descriptors;
          pcVar13 = local_40;
          pcVar9 = local_40 + lVar16;
          Memory::Recycler::WBSetBit(pcVar9);
          *(DescriptorMap **)(pcVar13 + lVar16) = pDVar3;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar9);
          lVar14 = lVar14 + 1;
        }
        uVar15 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar15;
      } while (uVar1 != uVar15);
      if (lVar14 != 0) {
        lVar16 = 8;
        do {
          DefineOwnPropertyHelper
                    (object,*(PropertyId *)(*(long *)(local_40 + lVar16 + -8) + 8),
                     (PropertyDescriptor *)(local_40 + lVar16),scriptContext,true);
          lVar16 = lVar16 + 0x38;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
  }
  LeavePinnedScope();
  return object;
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForProxyObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    Assert(VarIs<JavascriptProxy>(props));

    //1.  If Type(O) is not Object throw a TypeError exception.
    //2.  Let props be ToObject(Properties).

    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
    };

    //3.  Let keys be props.[[OwnPropertyKeys]]().
    //4.  ReturnIfAbrupt(keys).
    //5.  Let descriptors be an empty List.
    JavascriptArray* keys = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(props, scriptContext);
    uint32 length = keys->GetLength();

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, length);

    //6.  Repeat for each element nextKey of keys in List order,
    //    1.  Let propDesc be props.[[GetOwnProperty]](nextKey).
    //    2.  ReturnIfAbrupt(propDesc).
    //    3.  If propDesc is not undefined and propDesc.[[Enumerable]] is true, then
    //        1.  Let descObj be Get(props, nextKey).
    //        2.  ReturnIfAbrupt(descObj).
    //        3.  Let desc be ToPropertyDescriptor(descObj).
    //        4.  ReturnIfAbrupt(desc).
    //        5.  Append the pair(a two element List) consisting of nextKey and desc to the end of descriptors.
    Var nextKey;

    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    Var descObj;
    for (uint32 j = 0; j < length; j++)
    {
        PropertyDescriptor propertyDescriptor;
        nextKey = keys->DirectGetItem(j);
        AssertMsg(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        AssertMsg(propertyId != Constants::NoProperty, "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty.");

        if (JavascriptOperators::GetOwnPropertyDescriptor(props, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
        {
            if (propertyDescriptor.IsEnumerable())
            {
                descObj = JavascriptOperators::GetProperty(props, propertyId, scriptContext);

                if (!JavascriptOperators::ToPropertyDescriptor(descObj, &descriptors[descCount].descriptor, scriptContext))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyId)->GetBuffer());
                }

                if (CONFIG_FLAG(UseFullName))
                {
                    ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
                }

                descriptors[descCount].propRecord = propertyRecord;

                descCount++;
            }
        }
    }

    //7.  For each pair from descriptors in list order,
    //    1.  Let P be the first element of pair.
    //    2.  Let desc be the second element of pair.
    //    3.  Let status be DefinePropertyOrThrow(O, P, desc).
    //    4.  ReturnIfAbrupt(status).

    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    //8.  Return O.
    return object;
}